

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.h
# Opt level: O2

Polynomial<double> * __thiscall
gmath::Polynomial<double>::operator=(Polynomial<double> *this,Polynomial<double> *p)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  
  increase(this,p->used);
  pdVar1 = p->c;
  pdVar2 = this->c;
  for (lVar3 = 0; this->used = (int)lVar3, lVar3 < p->used; lVar3 = lVar3 + 1) {
    pdVar2[lVar3] = pdVar1[lVar3];
  }
  return this;
}

Assistant:

Polynomial<T> &operator=(const Polynomial<T> &p)
    {
      increase(p.getDegree()+1);

      for (used=0; used<=p.getDegree(); used++)
      {
        c[used]=p.c[used];
      }

      return *this;
    }